

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiguresTests.cpp
# Opt level: O1

void __thiscall
agge::tests::RectangleTests::RewindingIteratorStartsOverWithPoints(RectangleTests *this)

{
  rectangle r;
  point local_118;
  undefined8 local_10c;
  undefined4 local_104;
  undefined8 local_100;
  undefined4 local_f8;
  undefined8 local_f4;
  undefined4 local_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined8 local_dc;
  undefined4 local_d4;
  string local_d0;
  LocationInfo local_b0;
  point local_88;
  point local_7c;
  point local_70;
  point local_64;
  point local_58;
  point local_4c [2];
  rectangle local_34;
  
  rectangle::rectangle(&local_34,10.1,20.2,30.0,4.7);
  local_88.command = 0;
  local_88.x = 0.0;
  local_88.y = 0.0;
  rectangle::vertex(&local_34,&local_88.x,&local_88.y);
  local_88.command = 0;
  local_88.x = 0.0;
  local_88.y = 0.0;
  rectangle::vertex(&local_34,&local_88.x,&local_88.y);
  rectangle::rewind(&local_34,(FILE *)0x0);
  local_118.command = 0;
  local_118.x = 0.0;
  local_118.y = 0.0;
  local_88.command = rectangle::vertex(&local_34,&local_118.x,&local_118.y);
  local_88.x = local_118.x;
  local_88.y = local_118.y;
  local_118.command = 0;
  local_118.x = 0.0;
  local_118.y = 0.0;
  local_7c.command = rectangle::vertex(&local_34,&local_118.x,&local_118.y);
  local_7c.x = local_118.x;
  local_7c.y = local_118.y;
  local_118.command = 0;
  local_118.x = 0.0;
  local_118.y = 0.0;
  local_70.command = rectangle::vertex(&local_34,&local_118.x,&local_118.y);
  local_70.x = local_118.x;
  local_70.y = local_118.y;
  local_118.command = 0;
  local_118.x = 0.0;
  local_118.y = 0.0;
  local_64.command = rectangle::vertex(&local_34,&local_118.x,&local_118.y);
  local_64.x = local_118.x;
  local_64.y = local_118.y;
  local_118.command = 0;
  local_118.x = 0.0;
  local_118.y = 0.0;
  local_58.command = rectangle::vertex(&local_34,&local_118.x,&local_118.y);
  local_58.x = local_118.x;
  local_58.y = local_118.y;
  local_118.command = 0;
  local_118.x = 0.0;
  local_118.y = 0.0;
  local_4c[0].command = rectangle::vertex(&local_34,&local_118.x,&local_118.y);
  local_4c[0].x = local_118.x;
  local_4c[0].y = local_118.y;
  local_118.x = 10.1;
  local_118.y = 20.2;
  local_118.command = 1;
  local_10c = 0x41a1999a41f00000;
  local_104 = 2;
  local_100 = 0x4096666641f00000;
  local_f8 = 2;
  local_f4 = 0x409666664121999a;
  local_ec = 2;
  uStack_e8 = 0;
  uStack_e4 = 0;
  uStack_e0 = 0x30;
  local_dc = 0;
  local_d4 = 0;
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/FiguresTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_b0,&local_d0,0x99);
  ut::are_equal<agge::tests::mocks::path::point,agge::tests::mocks::path::point,6ul>
            ((point (*) [6])&local_118,(point (*) [6])&local_88,&local_b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.filename._M_dataplus._M_p != &local_b0.filename.field_2) {
    operator_delete(local_b0.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  return;
}

Assistant:

test( RewindingIteratorStartsOverWithPoints )
			{
				// INIT
				rectangle r(10.1f, 20.2f, 30.0f, 4.7f);

				vertex(r), vertex(r);

				// ACT
				r.rewind(0);

				// ASSERT
				mocks::path::point points[] = { vertex(r), vertex(r), vertex(r), vertex(r), vertex(r), vertex(r), };
				mocks::path::point reference[] = {
					moveto(10.1f, 20.2f), lineto(30.0f, 20.2f), lineto(30.0f, 4.7f), lineto(10.1f, 4.7f),
					{ 0.0f, 0.0f, path_command_end_poly | path_flag_close }, stop(),
				};

				assert_equal(reference, points);
			}